

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trend.cpp
# Opt level: O3

RegressionModel Trend::fromString(string *value)

{
  long lVar1;
  pointer_____offset_0x10___ *ppuVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  ulong *puVar6;
  undefined8 local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ppuVar2 = std::
            __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (enum_RegressionModel_strings,&KrigingException::typeinfo,value);
  if (ppuVar2 != &KrigingException::typeinfo) {
    return (RegressionModel)((ulong)(ppuVar2 + -0x398da) >> 3);
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
  std::operator+(&local_38,"Cannot convert \'",value);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_38);
  puVar5 = (ulong *)*plVar4;
  puVar6 = (ulong *)(plVar4 + 2);
  if (puVar5 == puVar6) {
    local_48 = *puVar6;
    uStack_40 = (undefined4)plVar4[3];
    uStack_3c = *(undefined4 *)((long)plVar4 + 0x1c);
    puVar5 = &local_48;
  }
  else {
    local_48 = *puVar6;
  }
  lVar1 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  *puVar3 = &PTR__KrigingException_001cc720;
  puVar3[1] = puVar3 + 3;
  if (puVar5 == &local_48) {
    *(undefined4 *)(puVar3 + 3) = (undefined4)local_48;
    *(undefined4 *)((long)puVar3 + 0x1c) = local_48._4_4_;
    *(undefined4 *)(puVar3 + 4) = uStack_40;
    *(undefined4 *)((long)puVar3 + 0x24) = uStack_3c;
  }
  else {
    puVar3[1] = puVar5;
    puVar3[3] = local_48;
  }
  puVar3[2] = lVar1;
  local_48 = local_48 & 0xffffffffffffff00;
  __cxa_throw(puVar3,&KrigingException::typeinfo,KrigingException::~KrigingException);
}

Assistant:

Trend::RegressionModel Trend::fromString(const std::string& value) {
  static auto begin = std::begin(Trend::enum_RegressionModel_strings);
  static auto end = std::end(Trend::enum_RegressionModel_strings);

  auto find = std::find(begin, end, value);
  if (find != end) {
    return static_cast<Trend::RegressionModel>(std::distance(begin, find));
  } else {
    // FIXME use std::optional as returned type
    throw KrigingException("Cannot convert '" + value + "' as a regression model");
  }
}